

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,char *desc_align
          ,char *desc_memidx,char *desc_offset,uint8_t *lane_val)

{
  bool bVar1;
  Result RVar2;
  bool local_41;
  char *pcStack_40;
  bool has_memidx;
  char *desc_memidx_local;
  char *desc_align_local;
  Address *offset_local;
  Index *memidx_local;
  Address *alignment_log2_local;
  BinaryReader *this_local;
  
  local_41 = false;
  pcStack_40 = desc_memidx;
  desc_memidx_local = desc_align;
  desc_align_local = (char *)offset;
  offset_local = (Address *)memidx;
  memidx_local = (Index *)alignment_log2;
  alignment_log2_local = &this->read_end_;
  RVar2 = ReadAlignment(this,alignment_log2,desc_align);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = TakeHasMemidx(this,(Address *)memidx_local,&local_41);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = CheckAlignment(this,(Address *)memidx_local,desc_memidx_local);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        *(undefined4 *)offset_local = 0;
        if ((local_41 & 1U) != 0) {
          bVar1 = Features::multi_memory_enabled(&this->options_->features);
          if (!bVar1) {
            PrintError(this,"multi_memory not allowed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2 = ReadMemidx(this,(Index *)offset_local,pcStack_40);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2 = ReadAddress(this,(Address *)desc_align_local,0,desc_offset);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          if (lane_val != (uint8_t *)0x0) {
            RVar2 = ReadU8(this,lane_val,"Lane idx");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemLocation(Address* alignment_log2,
                                     Index* memidx,
                                     Address* offset,
                                     const char* desc_align,
                                     const char* desc_memidx,
                                     const char* desc_offset,
                                     uint8_t* lane_val) {
  bool has_memidx = false;
  CHECK_RESULT(ReadAlignment(alignment_log2, desc_align));
  CHECK_RESULT(TakeHasMemidx(alignment_log2, &has_memidx));
  CHECK_RESULT(CheckAlignment(alignment_log2, desc_align));
  *memidx = 0;
  if (has_memidx) {
    ERROR_IF(!options_.features.multi_memory_enabled(),
             "multi_memory not allowed");
    CHECK_RESULT(ReadMemidx(memidx, desc_memidx));
  }
  CHECK_RESULT(ReadAddress(offset, 0, desc_offset));

  if (lane_val) {
    CHECK_RESULT(ReadU8(lane_val, "Lane idx"));
  }

  return Result::Ok;
}